

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O3

int CVmObjFile::query_safety_for_open(char *lclfname,int access)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  char *filename;
  
  uVar1 = (*G_host_ifc_X->_vptr_CVmHostIfc[2])();
  uVar2 = (*G_host_ifc_X->_vptr_CVmHostIfc[3])();
  if (access - 0x1000U < 7) {
    if ((0x6dU >> (access - 0x1000U & 0x1f) & 1) != 0) goto LAB_0027f13f;
LAB_0027f15a:
    if ((int)uVar1 < 2) {
      return 1;
    }
    if (3 < uVar1) {
      return 0;
    }
  }
  else if (access - 2U < 3) {
LAB_0027f13f:
    if ((int)uVar2 < 1) {
      return 1;
    }
    if (2 < uVar2) {
      return 0;
    }
  }
  else if (access == 1) goto LAB_0027f15a;
  filename = G_sandbox_path_X;
  if (G_sandbox_path_X == (char *)0x0) {
    filename = G_file_path_X;
  }
  iVar4 = 0;
  if (access == 0x1004) {
    iVar4 = 1;
  }
  else if (access == 0x1001) {
    iVar3 = os_is_file_in_dir(filename,lclfname,1,1);
    goto LAB_0027f1bc;
  }
  iVar3 = 0;
LAB_0027f1bc:
  iVar4 = os_is_file_in_dir(lclfname,filename,1,iVar4);
  return (uint)(iVar4 != 0 || iVar3 != 0);
}

Assistant:

int CVmObjFile::query_safety_for_open(VMG_ const char *lclfname, int access)
{
    /* get the current file safety level from the host application */
    int read_level = G_host_ifc->get_io_safety_read();
    int write_level = G_host_ifc->get_io_safety_write();

    /* 
     *   First check to see if the safety level allows or disallows the
     *   requested access without regard to location.  If so, we can save a
     *   little work by skipping the sandbox resolution.
     */
    switch (access)
    {
    case VMOBJFILE_ACCESS_READ:
    case VMOBJFILE_ACCESS_GETINFO:
    case VMOBJFILE_ACCESS_READDIR:
        /* 
         *   Read a file or its metadata.  If the safety level is READ_ANY or
         *   below, we can read any file regardless of location.  If it's
         *   MAXIMUM, we can't read anything.
         */
        if (read_level <= VM_IO_SAFETY_READ_ANY_WRITE_CUR)
            return TRUE;
        if (read_level >= VM_IO_SAFETY_MAXIMUM)
            return FALSE;
        break;

    case VMOBJFILE_ACCESS_RMDIR:
    case VMOBJFILE_ACCESS_WRITE:
    case VMOBJFILE_ACCESS_RW_KEEP:
    case VMOBJFILE_ACCESS_RW_TRUNC:
    case VMOBJFILE_ACCESS_DELETE:
    case VMOBJFILE_ACCESS_MKDIR:
    case VMOBJFILE_ACCESS_RENAME_FROM:
    case VMOBJFILE_ACCESS_RENAME_TO:
        /* 
         *   Writing, deleting, renaming, creating/removing a directory.  If
         *   the safety level is MINIMUM, we're allowed to write anywhere.
         *   If it's WRITE_CUR or higher, writing isn't allowed anywhere.
         */
        if (write_level <= VM_IO_SAFETY_MINIMUM)
            return TRUE;
        if (write_level >= VM_IO_SAFETY_READ_CUR)
            return FALSE;
        break;
    }

    /* 
     *   If we get this far, it means we're in sandbox mode, so the access is
     *   conditional on the file's location relative to the sandbox folder.
     *   Get the sandbox path, defaulting to the file base path.
     */
    const char *sandbox = (G_sandbox_path != 0 ? G_sandbox_path : G_file_path);

    /* assume the file isn't in the sandbox */
    int in_sandbox = FALSE;

    /* 
     *   Most operations in sandbox mode don't consider the sandbox directory
     *   itself to be part of the sandbox - e.g., you can't delete the
     *   sandbox folder. 
     */
    int match_self = FALSE;

    /*
     *   The effective sandbox extends beyond the actual contents the sandbox
     *   directory for a couple of modes:
     *   
     *   - For READDIR mode (reading the contents of a directory), the
     *   sandbox directory itself is considered part of the sandbox, since
     *   the information we're accessing in creating a directory listing is
     *   really the directory's contents.
     *   
     *   - For GETINFO mode (read file metadata), extend the sandbox to
     *   include the sandbox directory itself, its parent, its parent's
     *   parent, etc.  It's pretty obvious that we should have metadata read
     *   access to the sandbox directory itself, given that we can list and
     *   access its contents.  The rationale for also including parents of
     *   the sandbox folder is that they're effectively part of its metadata,
     *   since they're visible in its full path name.
     */
    switch (access)
    {
    case VMOBJFILE_ACCESS_GETINFO:
        /*
         *   read metadata - the sandbox directory is part of the sandbox for
         *   this operation, as is its parent, its parent's parent, etc
         *   (which is to say, any folder that contains the sandbox)
         */
        in_sandbox |= os_is_file_in_dir(sandbox, lclfname, TRUE, TRUE);
        break;

    case VMOBJFILE_ACCESS_READDIR:
        /* 
         *   read directory contents - the sandbox directory itself is part
         *   of the sandbox for this mode 
         */
        match_self = TRUE;
        break;
    }

    /* 
     *   Check to see if the file is in the sandbox folder (or any subfolder
     *   thereof).  If not, we may have to disallow the operation based on
     *   safety level settings, but for now just note the location status.
     */
    in_sandbox |= os_is_file_in_dir(lclfname, sandbox, TRUE, match_self);

    /* if the file isn't in the sandbox, access isn't allowed */
    if (!in_sandbox)
        return FALSE;

    /* didn't find any problems - allow the access */
    return TRUE;
}